

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.c
# Opt level: O2

lrtr_ip_addr *
lrtr_ip_addr_get_bits
          (lrtr_ip_addr *__return_storage_ptr__,lrtr_ip_addr *val,uint8_t from,uint8_t number)

{
  long lVar1;
  lrtr_ipv4_addr lVar2;
  long in_FS_OFFSET;
  bool bVar3;
  lrtr_ipv6_addr lVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = val->ver != LRTR_IPV6;
  if (bVar3) {
    lVar2 = lrtr_ipv4_get_bits(&(val->u).addr4,from,number);
    (__return_storage_ptr__->u).addr4.addr = lVar2.addr;
  }
  else {
    lVar4 = lrtr_ipv6_get_bits(&(val->u).addr6,from,number);
    *&(__return_storage_ptr__->u).addr6.addr = lVar4.addr;
  }
  __return_storage_ptr__->ver = (uint)!bVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

struct lrtr_ip_addr lrtr_ip_addr_get_bits(const struct lrtr_ip_addr *val, const uint8_t from, const uint8_t number)
{
	struct lrtr_ip_addr result;

	if (val->ver == LRTR_IPV6) {
		result.ver = LRTR_IPV6;
		result.u.addr6 = lrtr_ipv6_get_bits(&(val->u.addr6), from, number);
	} else {
		result.ver = LRTR_IPV4;
		result.u.addr4 = lrtr_ipv4_get_bits(&(val->u.addr4), from, number);
	}
	return result;
}